

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

size_t __thiscall Lodtalk::MethodAssembler::PushClosure::computeBetterSize(PushClosure *this)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  PushClosure *this_local;
  
  iVar1 = extendAValue(this);
  sVar2 = InstructionNode::sizeofExtA(&this->super_InstructionNode,(long)iVar1);
  iVar1 = extendBValue(this);
  sVar3 = InstructionNode::sizeofExtB(&this->super_InstructionNode,(long)iVar1);
  return sVar2 + 3 + sVar3;
}

Assistant:

virtual size_t computeBetterSize()
	{
		return 3 + sizeofExtA(extendAValue()) + sizeofExtB(extendBValue());
	}